

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

bool __thiscall CDirectiveIncbin::Validate(CDirectiveIncbin *this,ValidateState *state)

{
  bool bVar1;
  int64_t iVar2;
  Architecture *pAVar3;
  ValidateState *state_local;
  CDirectiveIncbin *this_local;
  
  iVar2 = FileManager::getVirtualAddress(g_fileManager);
  this->virtualAddress = iVar2;
  bVar1 = Expression::isLoaded(&this->startExpression);
  if (bVar1) {
    bVar1 = Expression::evaluateInteger<long>(&this->startExpression,&this->start);
    if (!bVar1) {
      Logger::queueError<>(Error,"Invalid position expression");
      return false;
    }
    if (this->fileSize < this->start) {
      Logger::queueError<>(Error,"Start position past end of file");
      return false;
    }
  }
  else {
    this->start = 0;
  }
  bVar1 = Expression::isLoaded(&this->sizeExpression);
  if (bVar1) {
    bVar1 = Expression::evaluateInteger<long>(&this->sizeExpression,&this->size);
    if (!bVar1) {
      Logger::queueError<>(Error,"Invalid size expression");
      return false;
    }
  }
  else {
    this->size = this->fileSize - this->start;
  }
  if (this->fileSize < this->start + this->size) {
    Logger::queueError<>(Warning,"Read size truncated due to file size");
    this->size = this->fileSize - this->start;
  }
  pAVar3 = Architecture::current();
  (*pAVar3->_vptr_Architecture[3])();
  FileManager::advanceMemory(g_fileManager,this->size);
  return false;
}

Assistant:

bool CDirectiveIncbin::Validate(const ValidateState &state)
{
	virtualAddress = g_fileManager->getVirtualAddress();

	if (startExpression.isLoaded())
	{
		if (!startExpression.evaluateInteger(start))
		{
			Logger::queueError(Logger::Error, "Invalid position expression");
			return false;
		}

		if (start > fileSize)
		{
			Logger::queueError(Logger::Error, "Start position past end of file");
			return false;
		}
	} else {
		start = 0;
	}

	if (sizeExpression.isLoaded())
	{
		if (!sizeExpression.evaluateInteger(size))
		{
			Logger::queueError(Logger::Error, "Invalid size expression");
			return false;
		}
	} else {
		size = fileSize-start;
	}

	if (start+size > fileSize)
	{
		Logger::queueError(Logger::Warning, "Read size truncated due to file size");
		size = fileSize-start;
	}

	Architecture::current().NextSection();
	g_fileManager->advanceMemory(size);
	return false;
}